

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

string_view __thiscall
absl::lts_20250127::log_internal::anon_unknown_4::Basename
          (anon_unknown_4 *this,string_view filepath)

{
  size_type sVar1;
  string_view sVar2;
  string_view filepath_local;
  
  filepath_local._M_str = (char *)filepath._M_len;
  filepath_local._M_len = (size_t)this;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&filepath_local,'/',0xffffffffffffffff);
  sVar2._M_len = filepath_local._M_len - (sVar1 + 1);
  sVar2._M_str = filepath_local._M_str + sVar1 + 1;
  return sVar2;
}

Assistant:

absl::string_view Basename(absl::string_view filepath) {
#ifdef _WIN32
  size_t path = filepath.find_last_of("/\\");
#else
  size_t path = filepath.find_last_of('/');
#endif
  if (path != filepath.npos) filepath.remove_prefix(path + 1);
  return filepath;
}